

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

TypeDef winmd::reader::find(TypeRef *type)

{
  bool bVar1;
  ResolutionScope RVar2;
  database *this;
  cache *pcVar3;
  reference pTVar4;
  coded_index<winmd::reader::ResolutionScope> cVar5;
  TypeDef TVar6;
  TypeRef TVar7;
  __normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
  local_108;
  string_view local_100;
  __normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
  local_f0;
  __normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
  local_e8;
  __normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
  local_e0;
  __normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
  iter;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *nested_types;
  typed_index<winmd::reader::ResolutionScope> local_a0;
  TypeRef local_90;
  undefined1 local_80 [8];
  TypeDef enclosing_type;
  string_view local_60;
  string_view local_50;
  table_base *local_40;
  uint32_t local_38;
  index_base<winmd::reader::ResolutionScope> local_30;
  row_base<winmd::reader::TypeRef> *local_20;
  TypeRef *type_local;
  uint32_t local_10;
  
  local_20 = &type->super_row_base<winmd::reader::TypeRef>;
  cVar5 = TypeRef::ResolutionScope(type);
  local_40 = cVar5.super_typed_index<winmd::reader::ResolutionScope>.
             super_index_base<winmd::reader::ResolutionScope>.m_table;
  local_38 = cVar5.super_typed_index<winmd::reader::ResolutionScope>.
             super_index_base<winmd::reader::ResolutionScope>.m_value;
  local_30.m_table = local_40;
  local_30.m_value = local_38;
  RVar2 = index_base<winmd::reader::ResolutionScope>::type(&local_30);
  if (RVar2 == TypeRef) {
    cVar5 = TypeRef::ResolutionScope((TypeRef *)local_20);
    local_a0.super_index_base<winmd::reader::ResolutionScope>.m_table =
         cVar5.super_typed_index<winmd::reader::ResolutionScope>.
         super_index_base<winmd::reader::ResolutionScope>.m_table;
    local_a0.super_index_base<winmd::reader::ResolutionScope>.m_value =
         cVar5.super_typed_index<winmd::reader::ResolutionScope>.
         super_index_base<winmd::reader::ResolutionScope>.m_value;
    TVar7 = typed_index<winmd::reader::ResolutionScope>::TypeRef(&local_a0);
    local_90.super_row_base<winmd::reader::TypeRef>.m_table =
         TVar7.super_row_base<winmd::reader::TypeRef>.m_table;
    local_90.super_row_base<winmd::reader::TypeRef>.m_index =
         TVar7.super_row_base<winmd::reader::TypeRef>.m_index;
    TVar6 = find(&local_90);
    local_80 = (undefined1  [8])TVar6.super_row_base<winmd::reader::TypeDef>.m_table;
    enclosing_type.super_row_base<winmd::reader::TypeDef>.m_table._0_4_ =
         TVar6.super_row_base<winmd::reader::TypeDef>.m_index;
    bVar1 = row_base::operator_cast_to_bool((row_base *)local_80);
    if (bVar1) {
      pcVar3 = row_base<winmd::reader::TypeDef>::get_cache
                         ((row_base<winmd::reader::TypeDef> *)local_80);
      iter._M_current = (TypeDef *)cache::nested_types(pcVar3,(TypeDef *)local_80);
      local_e8._M_current =
           (TypeDef *)
           cppwinrt::std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
           begin((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                 iter._M_current);
      local_f0._M_current =
           (TypeDef *)
           cppwinrt::std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
           end((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
               iter._M_current);
      local_100 = TypeRef::TypeName((TypeRef *)local_20);
      local_e0 = std::
                 find_if<__gnu_cxx::__normal_iterator<winmd::reader::TypeDef_const*,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>>,winmd::reader::find(winmd::reader::TypeRef_const&)::_lambda(winmd::reader::TypeDef_const&)_1_>
                           (local_e8,local_f0,(anon_class_16_1_898f2789_for__M_pred)local_100);
      local_108._M_current =
           (TypeDef *)
           cppwinrt::std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
           end((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
               iter._M_current);
      bVar1 = __gnu_cxx::operator==(&local_e0,&local_108);
      if (bVar1) {
        memset(&type_local,0,0x10);
        TypeDef::TypeDef((TypeDef *)&type_local);
      }
      else {
        pTVar4 = __gnu_cxx::
                 __normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
                 ::operator*(&local_e0);
        type_local = (TypeRef *)(pTVar4->super_row_base<winmd::reader::TypeDef>).m_table;
        local_10 = (uint32_t)
                   *(undefined8 *)&(pTVar4->super_row_base<winmd::reader::TypeDef>).m_index;
      }
    }
    else {
      memset(&type_local,0,0x10);
      TypeDef::TypeDef((TypeDef *)&type_local);
    }
  }
  else {
    this = row_base<winmd::reader::TypeRef>::get_database(local_20);
    pcVar3 = database::get_cache(this);
    local_50 = TypeRef::TypeNamespace((TypeRef *)local_20);
    local_60 = TypeRef::TypeName((TypeRef *)local_20);
    TVar6 = cache::find(pcVar3,&local_50,&local_60);
    type_local = (TypeRef *)TVar6.super_row_base<winmd::reader::TypeDef>.m_table;
    local_10 = TVar6.super_row_base<winmd::reader::TypeDef>.m_index;
  }
  TVar6.super_row_base<winmd::reader::TypeDef>.m_index = local_10;
  TVar6.super_row_base<winmd::reader::TypeDef>.m_table = (table_base *)type_local;
  TVar6.super_row_base<winmd::reader::TypeDef>._12_4_ = 0;
  return (TypeDef)TVar6.super_row_base<winmd::reader::TypeDef>;
}

Assistant:

inline auto find(TypeRef const& type)
    {
        if (type.ResolutionScope().type() != ResolutionScope::TypeRef)
        {
            return type.get_database().get_cache().find(type.TypeNamespace(), type.TypeName());
        }
        else
        {
            auto enclosing_type = find(type.ResolutionScope().TypeRef());
            if (!enclosing_type)
            {
                return TypeDef{};
            }
            auto const& nested_types = enclosing_type.get_cache().nested_types(enclosing_type);
            auto iter = std::find_if(nested_types.begin(), nested_types.end(),
                [name = type.TypeName()](TypeDef const& arg)
            {
                return name == arg.TypeName();
            });
            if (iter == nested_types.end())
            {
                return TypeDef{};
            }
            return *iter;
        }
    }